

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerHLSL::image_type_hlsl_modern_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRType *type,uint32_t id)

{
  uint32_t id_00;
  CompilerError *pCVar1;
  size_type sVar2;
  uint *puVar3;
  char (*in_R8) [2];
  char (*in_R9) [2];
  bool bVar4;
  char (*in_stack_fffffffffffffe40) [2];
  byte local_1a9;
  bool local_189;
  bool local_142;
  spirv_cross local_140 [32];
  string local_120;
  char *local_100;
  char *rw;
  char *ms;
  char *arrayed;
  spirv_cross local_e0 [32];
  string local_c0;
  char *local_a0;
  char *rw_1;
  string local_78 [48];
  ID local_48;
  bool local_41;
  undefined1 local_40 [7];
  bool force_image_srv;
  uint32_t components;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  bool typed_load;
  char *dim;
  SPIRType *imagetype;
  SPIRType *pSStack_20;
  uint32_t id_local;
  SPIRType *type_local;
  CompilerHLSL *this_local;
  
  imagetype._4_4_ = id;
  pSStack_20 = type;
  type_local = (SPIRType *)this;
  this_local = (CompilerHLSL *)__return_storage_ptr__;
  id_00 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->image);
  dim = (char *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id_00);
  components._0_1_ = '\0';
  components._1_1_ = '\0';
  components._2_1_ = '\0';
  components._3_1_ = '\0';
  cStack_34 = '\0';
  cStack_33 = '\0';
  cStack_32 = '\0';
  typed_load = false;
  force_image_srv = false;
  local_40._0_4_ = 4;
  local_142 = false;
  if (((this->hlsl_options).nonwritable_uav_texture_as_srv & 1U) != 0) {
    TypedID<(spirv_cross::Types)0>::TypedID(&local_48,imagetype._4_4_);
    local_142 = Compiler::has_decoration((Compiler *)this,local_48,DecorationNonWritable);
  }
  local_41 = local_142;
  switch((pSStack_20->image).dim) {
  case Dim1D:
    force_image_srv = (pSStack_20->image).sampled == 2;
    _components = (char  [8])((long)"Sampled1D" + 7);
    break;
  case Dim2D:
    force_image_srv = (pSStack_20->image).sampled == 2;
    _components = (char  [8])((long)"Image \'Dim\' must be 2D" + 0x14);
    break;
  case Dim3D:
    force_image_srv = (pSStack_20->image).sampled == 2;
    _components = (char  [8])((long)"iimage3D" + 6);
    break;
  case Cube:
    if ((pSStack_20->image).sampled == 2) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar1,"RWTextureCube does not exist in HLSL.");
      __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    _components = (char  [8])((long)"Image \'Dim\' cannot be Cube" + 0x16);
    break;
  case DimRect:
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (pCVar1,"Rectangle texture support is not yet implemented for HLSL.");
    __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case Buffer:
    if ((pSStack_20->image).sampled == 1) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_78,this,dim,0);
      join<char_const(&)[8],std::__cxx11::string,unsigned_int&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)0x5950fa,(char (*) [8])local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (uint *)0x5a981b,in_R9);
      ::std::__cxx11::string::~string(local_78);
      return __return_storage_ptr__;
    }
    if ((pSStack_20->image).sampled != 2) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar1,
                 "Sampler buffers must be either sampled or unsampled. Cannot deduce in runtime.");
      __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    sVar2 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                    (key_type *)((long)&imagetype + 4));
    if (sVar2 != 0) {
      image_format_to_type_abi_cxx11_
                ((string *)&rw_1,(pSStack_20->image).format,*(BaseType *)(dim + 0x10));
      join<char_const(&)[25],std::__cxx11::string,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)"RasterizerOrderedBuffer<",
                 (char (*) [25])&rw_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a981b,in_R8
                );
      ::std::__cxx11::string::~string((string *)&rw_1);
      return __return_storage_ptr__;
    }
    local_189 = false;
    if ((local_41 & 1U) == 0) {
      local_189 = (pSStack_20->image).sampled == 2;
    }
    force_image_srv = local_189;
    local_a0 = "RW";
    if ((local_41 & 1U) != 0) {
      local_a0 = "";
    }
    arrayed._7_1_ = 0;
    if (local_189 == false) {
      puVar3 = (uint *)0x0;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_e0,this,dim);
      arrayed._7_1_ = 1;
      join<std::__cxx11::string,unsigned_int&>
                (&local_c0,local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 puVar3);
    }
    else {
      image_format_to_type_abi_cxx11_
                (&local_c0,(pSStack_20->image).format,*(BaseType *)(dim + 0x10));
    }
    join<char_const*&,char_const(&)[8],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&local_a0,(char **)0x5950fa,
               (char (*) [8])&local_c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a981b,in_R9);
    ::std::__cxx11::string::~string((string *)&local_c0);
    if ((arrayed._7_1_ & 1) == 0) {
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::~string((string *)local_e0);
    return __return_storage_ptr__;
  case DimSubpassData:
    _components = (char  [8])((long)"Image \'Dim\' must be 2D" + 0x14);
    force_image_srv = false;
    break;
  default:
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar1,"Invalid dimension.");
    __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  ms = "";
  if (((pSStack_20->image).arrayed & 1U) != 0) {
    ms = "Array";
  }
  rw = "";
  if (((pSStack_20->image).ms & 1U) != 0) {
    rw = "MS";
  }
  local_1a9 = 0;
  if ((force_image_srv & 1U) != 0) {
    local_1a9 = local_142 ^ 0xff;
  }
  local_100 = "";
  if ((local_1a9 & 1) != 0) {
    local_100 = "RW";
  }
  if (local_142 != false) {
    force_image_srv = false;
  }
  if (((force_image_srv & 1U) != 0) &&
     (sVar2 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                      (key_type *)((long)&imagetype + 4)), sVar2 != 0)) {
    local_100 = "RasterizerOrdered";
  }
  bVar4 = (force_image_srv & 1U) == 0;
  if (bVar4) {
    puVar3 = (uint *)0x0;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_140,this,dim);
    join<std::__cxx11::string,unsigned_int&>
              (&local_120,local_140,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,puVar3)
    ;
  }
  else {
    image_format_to_type_abi_cxx11_(&local_120,(pSStack_20->image).format,*(BaseType *)(dim + 0x10))
    ;
  }
  join<char_const*&,char_const(&)[8],char_const*&,char_const*&,char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
            (__return_storage_ptr__,(spirv_cross *)&local_100,(char **)"Texture",
             (char (*) [8])&components,&rw,&ms,(char **)0x569209,(char (*) [2])&local_120,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a981b,
             in_stack_fffffffffffffe40);
  ::std::__cxx11::string::~string((string *)&local_120);
  if (bVar4) {
    ::std::__cxx11::string::~string((string *)local_140);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::image_type_hlsl_modern(const SPIRType &type, uint32_t id)
{
	auto &imagetype = get<SPIRType>(type.image.type);
	const char *dim = nullptr;
	bool typed_load = false;
	uint32_t components = 4;

	bool force_image_srv = hlsl_options.nonwritable_uav_texture_as_srv && has_decoration(id, DecorationNonWritable);

	switch (type.image.dim)
	{
	case Dim1D:
		typed_load = type.image.sampled == 2;
		dim = "1D";
		break;
	case Dim2D:
		typed_load = type.image.sampled == 2;
		dim = "2D";
		break;
	case Dim3D:
		typed_load = type.image.sampled == 2;
		dim = "3D";
		break;
	case DimCube:
		if (type.image.sampled == 2)
			SPIRV_CROSS_THROW("RWTextureCube does not exist in HLSL.");
		dim = "Cube";
		break;
	case DimRect:
		SPIRV_CROSS_THROW("Rectangle texture support is not yet implemented for HLSL."); // TODO
	case DimBuffer:
		if (type.image.sampled == 1)
			return join("Buffer<", type_to_glsl(imagetype), components, ">");
		else if (type.image.sampled == 2)
		{
			if (interlocked_resources.count(id))
				return join("RasterizerOrderedBuffer<", image_format_to_type(type.image.format, imagetype.basetype),
				            ">");

			typed_load = !force_image_srv && type.image.sampled == 2;

			const char *rw = force_image_srv ? "" : "RW";
			return join(rw, "Buffer<",
			            typed_load ? image_format_to_type(type.image.format, imagetype.basetype) :
			                         join(type_to_glsl(imagetype), components),
			            ">");
		}
		else
			SPIRV_CROSS_THROW("Sampler buffers must be either sampled or unsampled. Cannot deduce in runtime.");
	case DimSubpassData:
		dim = "2D";
		typed_load = false;
		break;
	default:
		SPIRV_CROSS_THROW("Invalid dimension.");
	}
	const char *arrayed = type.image.arrayed ? "Array" : "";
	const char *ms = type.image.ms ? "MS" : "";
	const char *rw = typed_load && !force_image_srv ? "RW" : "";

	if (force_image_srv)
		typed_load = false;

	if (typed_load && interlocked_resources.count(id))
		rw = "RasterizerOrdered";

	return join(rw, "Texture", dim, ms, arrayed, "<",
	            typed_load ? image_format_to_type(type.image.format, imagetype.basetype) :
	                         join(type_to_glsl(imagetype), components),
	            ">");
}